

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaffeConverter.cpp
# Opt level: O2

void CoreMLConverter::loadCaffeNetwork
               (string *srcPathWeights,NetParameter *caffeSpecWeights,string *srcPathProto,
               NetParameter *caffeSpecProto,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *meanImagePathProto,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
               *meanImageBlobProto)

{
  int *piVar1;
  bool bVar2;
  int file_descriptor;
  CodedInputStream *pCVar3;
  mapped_type *this;
  _Base_ptr p_Var4;
  runtime_error *prVar5;
  ostream *poVar6;
  string local_6c8;
  string local_6a8;
  string local_688 [32];
  IstreamInputStream raw_input_mean_image;
  IstreamInputStream raw_input;
  FileInputStream fileInput;
  stringstream msg;
  ostream local_430 [504];
  ifstream iarc;
  
  std::ifstream::ifstream((istream *)&iarc,(string *)srcPathWeights,_S_bin);
  google::protobuf::io::IstreamInputStream::IstreamInputStream(&raw_input,(istream *)&iarc,-1);
  pCVar3 = (CodedInputStream *)operator_new(0x50);
  google::protobuf::io::CodedInputStream::CodedInputStream
            (pCVar3,&raw_input.super_ZeroCopyInputStream);
  google::protobuf::io::CodedInputStream::SetTotalBytesLimit(pCVar3,0x7fffffff,0x20000000);
  bVar2 = google::protobuf::MessageLite::ParseFromCodedStream
                    ((MessageLite *)caffeSpecWeights,pCVar3);
  if (!bVar2) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    std::operator<<(local_430,"Unable to load caffe network Weights file: ");
    poVar6 = std::operator<<(local_430,(string *)srcPathWeights);
    std::operator<<(poVar6,". ");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&fileInput);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_6a8,(string *)srcPathWeights);
  upgradeCaffeNetworkIfNeeded(&local_6a8,caffeSpecWeights);
  std::__cxx11::string::~string((string *)&local_6a8);
  google::protobuf::io::CodedInputStream::~CodedInputStream(pCVar3);
  operator_delete(pCVar3,0x50);
  if (srcPathProto->_M_string_length != 0) {
    file_descriptor = open((srcPathProto->_M_dataplus)._M_p,0);
    google::protobuf::io::FileInputStream::FileInputStream(&fileInput,file_descriptor,-1);
    fileInput.copying_input_.close_on_delete_ = true;
    bVar2 = google::protobuf::TextFormat::Parse
                      (&fileInput.super_ZeroCopyInputStream,&caffeSpecProto->super_Message);
    if (!bVar2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
      std::operator<<(local_430,"Unable to load caffe network Prototxt file: ");
      std::operator<<(local_430,(string *)srcPathProto);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,(string *)&raw_input_mean_image);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_6c8,(string *)srcPathProto);
    upgradeCaffeNetworkIfNeeded(&local_6c8,caffeSpecProto);
    std::__cxx11::string::~string((string *)&local_6c8);
    google::protobuf::io::FileInputStream::~FileInputStream(&fileInput);
  }
  p_Var4 = (meanImagePathProto->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 == &(meanImagePathProto->_M_t)._M_impl.super__Rb_tree_header) {
      google::protobuf::io::IstreamInputStream::~IstreamInputStream(&raw_input);
      std::ifstream::~ifstream(&iarc);
      return;
    }
    std::ifstream::ifstream((istream *)&msg,(string *)(p_Var4 + 2),_S_bin);
    google::protobuf::io::IstreamInputStream::IstreamInputStream
              (&raw_input_mean_image,(istream *)&msg,-1);
    pCVar3 = (CodedInputStream *)operator_new(0x50);
    google::protobuf::io::CodedInputStream::CodedInputStream
              (pCVar3,&raw_input_mean_image.super_ZeroCopyInputStream);
    google::protobuf::io::CodedInputStream::SetTotalBytesLimit(pCVar3,0x7fffffff,0x20000000);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
           ::operator[](meanImageBlobProto,(key_type *)(p_Var4 + 1));
    bVar2 = google::protobuf::MessageLite::ParseFromCodedStream((MessageLite *)this,pCVar3);
    if (!bVar2) break;
    google::protobuf::io::CodedInputStream::~CodedInputStream(pCVar3);
    operator_delete(pCVar3,0x50);
    google::protobuf::io::IstreamInputStream::~IstreamInputStream(&raw_input_mean_image);
    std::ifstream::~ifstream((istream *)&msg);
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&fileInput);
  piVar1 = &fileInput.copying_input_.file_;
  std::operator<<((ostream *)piVar1,"Unable to load caffe network mean image binary proto file: ");
  std::operator<<((ostream *)piVar1,(string *)(p_Var4 + 2));
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,local_688);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CoreMLConverter::loadCaffeNetwork(const std::string& srcPathWeights,
                                      caffe::NetParameter& caffeSpecWeights,
                                      const std::string& srcPathProto,
                                      caffe::NetParameter& caffeSpecProto,
                                      const std::map<std::string, std::string>& meanImagePathProto,
                                      std::map<std::string, caffe::BlobProto>& meanImageBlobProto) {
    
    // Load the Caffemodel weights file
    std::ifstream iarc(srcPathWeights, std::ios::binary);
    google::protobuf::io::IstreamInputStream raw_input(&iarc);
    google::protobuf::io::CodedInputStream* coded_input = new google::protobuf::io::CodedInputStream(&raw_input);
    
    // Load in streams because these network files are going to be large and
    // protobuf default reader fails if messages are larger than 64MB.
    coded_input->SetTotalBytesLimit(kProtoReadBytesLimit, 536870912);
    bool openSuccess = caffeSpecWeights.ParseFromCodedStream(coded_input);
    if (!openSuccess) {
        std::stringstream msg;
        msg << "Unable to load caffe network Weights file: ";
        msg << srcPathWeights << ". ";
        throw std::runtime_error(msg.str());
    }
    CoreMLConverter::upgradeCaffeNetworkIfNeeded(srcPathWeights, caffeSpecWeights);
    delete coded_input;

    // Load the caffe prototxt file if applicable
    if (not srcPathProto.empty()) {
        int fileDescriptor = open(srcPathProto.c_str(), O_RDONLY);
        google::protobuf::io::FileInputStream fileInput(fileDescriptor);
        fileInput.SetCloseOnDelete( true );
        openSuccess = google::protobuf::TextFormat::Parse(&fileInput, &caffeSpecProto);
        if (!openSuccess) {
            std::stringstream msg;
            msg << "Unable to load caffe network Prototxt file: ";
            msg << srcPathProto;
            throw std::runtime_error(msg.str());
        }
        CoreMLConverter::upgradeCaffeNetworkIfNeeded(srcPathProto, caffeSpecProto);
    }
    
    // Load the binary proto file if available
    for (const auto& imageProto : meanImagePathProto) {
        std::ifstream iarc_mean_image(imageProto.second, std::ios::binary);
        google::protobuf::io::IstreamInputStream raw_input_mean_image(&iarc_mean_image);
        coded_input = new google::protobuf::io::CodedInputStream(&raw_input_mean_image);
        coded_input->SetTotalBytesLimit(kProtoReadBytesLimit, 536870912);
        openSuccess = meanImageBlobProto[imageProto.first].ParseFromCodedStream(coded_input);
        if (!openSuccess) {
            std::stringstream msg;
            msg << "Unable to load caffe network mean image binary proto file: ";
            msg << imageProto.second;
            throw std::runtime_error(msg.str());
        }
        delete coded_input;
    }
    
}